

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-routing.c
# Opt level: O3

void mpr_calculate_neighbor_graph_routing(nhdp_domain *domain,neighbor_graph *graph)

{
  uint uVar1;
  uint uVar2;
  oonf_log_source oVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  char *pcVar6;
  char *pcVar7;
  list_entity *plVar8;
  list_entity *plVar9;
  list_entity *plVar10;
  long lVar11;
  netaddr_str nbuf1;
  netaddr_str local_6e;
  
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x148,(void *)0x0,0,
             "Calculate neighbor graph for routing MPRs");
  }
  mpr_init_neighbor_graph(graph,&_rt_api_interface);
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0xfa,(void *)0x0,0,
             "Calculate N1 for routing MPRs");
  }
  plVar4 = nhdp_db_get_neigh_list();
  plVar4 = plVar4->next;
  plVar8 = plVar4->prev;
  plVar5 = nhdp_db_get_neigh_list();
  if (plVar8 != plVar5->prev) {
    do {
      *(undefined1 *)((long)&plVar4[-8].prev + 4) = 0;
      oVar3 = LOG_MPR;
      if (((*(uint *)&plVar4[(long)domain->index * 2 + 4].prev < 0xffff01) &&
          (0 < *(int *)((long)&plVar4[-9].prev + 4))) &&
         (*(char *)((long)&plVar4[(long)domain->index * 2 + 6].next + 3) != '\0')) {
        if ((log_global_mask[LOG_MPR] & 1) != 0) {
          pcVar6 = netaddr_to_prefixstring(&nbuf1,(netaddr *)&plVar4[-10].prev,false);
          oonf_log(LOG_SEVERITY_DEBUG,oVar3,"src/nhdp/mpr/neighbor-graph-routing.c",0x102,
                   (void *)0x0,0,"Add neighbor %s in: %u",pcVar6,
                   (short)*(undefined4 *)&plVar4[(long)domain->index * 2 + 4].prev);
        }
        mpr_add_n1_node_to_set(&graph->set_n1,(nhdp_neighbor *)&plVar4[-10].prev,(nhdp_link *)0x0,0)
        ;
      }
      plVar4 = plVar4->next;
      plVar8 = plVar4->prev;
      plVar5 = nhdp_db_get_neigh_list();
    } while (plVar8 != plVar5->prev);
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-routing.c",0x114,(void *)0x0,0,
             "Calculate N2 for routing MPRs");
  }
  plVar4 = (graph->set_n1).list_head.next;
  plVar8 = (graph->set_n1).list_head.prev;
  if (plVar4->prev != plVar8) {
    do {
      plVar9 = plVar4[-1].prev;
      plVar5 = plVar9[3].prev;
      if (plVar5->prev != plVar9[4].next) {
        do {
          plVar10 = plVar5[-5].prev;
          plVar8 = plVar5[-4].next;
          if (plVar10->prev != plVar8) {
            do {
              oVar3 = LOG_MPR;
              lVar11 = (long)domain->index;
              if (*(uint *)((long)&plVar10[7].next + lVar11 * 0xc) < 0xffff01) {
                if ((log_global_mask[LOG_MPR] & 1) != 0) {
                  plVar8 = plVar4[-1].prev;
                  pcVar6 = netaddr_to_prefixstring(&nbuf1,(netaddr *)(plVar10 + -8),false);
                  pcVar7 = netaddr_to_prefixstring(&local_6e,(netaddr *)&plVar4[-3].prev,false);
                  uVar1 = *(uint *)((long)&plVar10[7].next + lVar11 * 0xc);
                  uVar2 = *(uint *)((long)&plVar10[7].next + lVar11 * 0xc + 4);
                  oonf_log(LOG_SEVERITY_DEBUG,oVar3,"src/nhdp/mpr/neighbor-graph-routing.c",0x128,
                           (void *)0x0,0,
                           "Add twohop addr %s (over %s) in: %u out: %u (path-in: %u path-out: %u)",
                           pcVar6,pcVar7,(ulong)uVar1,(ulong)uVar2,
                           (ulong)(*(int *)&plVar8[lVar11 * 2 + 0xe].next + uVar1),
                           (short)(*(int *)((long)&plVar8[lVar11 * 2 + 0xe].next + 4) + uVar2));
                }
                mpr_add_addr_node_to_set(&graph->set_n2,*(netaddr *)(plVar10 + -8),0);
                plVar8 = plVar5[-4].next;
              }
              plVar10 = plVar10->next;
            } while (plVar10->prev != plVar8);
            plVar9 = plVar4[-1].prev;
          }
          plVar5 = plVar5->next;
        } while (plVar5->prev != plVar9[4].next);
        plVar8 = (graph->set_n1).list_head.prev;
      }
      plVar4 = plVar4->next;
    } while (plVar4->prev != plVar8);
  }
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_routing(const struct nhdp_domain *domain, struct neighbor_graph *graph) {
  struct neighbor_graph_interface *methods;

  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for routing MPRs");

  methods = _get_neighbor_graph_interface_routing();

  mpr_init_neighbor_graph(graph, methods);
  _calculate_n1(domain, graph);
  _calculate_n2(domain, graph);
}